

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_get(HTTP_INFO *hi,char *url,char *response,int size)

{
  BOOL verify;
  int iVar1;
  uint ret;
  uint len;
  int iVar2;
  long lVar3;
  size_t sVar4;
  byte https_00;
  char port [10];
  int opt;
  socklen_t slen;
  int https;
  char err [100];
  char host [256];
  char dir [1024];
  char request [1024];
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  verify = (hi->tls).verify;
  parse_url(url,&https,host,port,dir);
  iVar2 = (hi->tls).ssl_fd.fd;
  if ((((iVar2 == -1) || (https_00 = (hi->url).https, https != (uint)https_00)) ||
      (iVar1 = strcmp((hi->url).host,host), iVar1 != 0)) ||
     (iVar1 = strcmp((hi->url).port,port), iVar1 != 0)) {
    https_close(hi);
    https_00 = (byte)https;
LAB_0011090f:
    https_init(hi,https_00,verify);
    ret = https_connect(hi,host,port);
    if ((int)ret < 0) {
      https_close(hi);
      mbedtls_strerror(ret,err,100);
      goto LAB_00110a98;
    }
  }
  else {
    slen = 4;
    iVar2 = getsockopt(iVar2,1,4,&opt,&slen);
    if ((iVar2 < 0) || (0 < opt)) {
      https_close(hi);
      goto LAB_0011090f;
    }
  }
  len = snprintf(request,0x400,
                 "GET %s HTTP/1.1\r\nUser-Agent: Mozilla/4.0\r\nHost: %s:%s\r\nContent-Type: application/json; charset=utf-8\r\nConnection: Keep-Alive\r\n%s\r\n"
                 ,dir,host,port,(hi->request).cookie);
  ret = https_write(hi,request,len);
  if (ret == len) {
    (hi->response).status = 0;
    (hi->response).content_length = 0;
    lVar3 = 0;
    (hi->response).close = '\0';
    hi->r_len = 0;
    hi->header_end = '\0';
    hi->body = response;
    hi->body_size = (long)size;
    hi->body_len = 0;
    do {
      ret = https_read(hi,hi->r_buf + lVar3,0x800 - (int)lVar3);
      if (ret != 0xffff9700) {
        if ((int)ret < 0) {
          https_close(hi);
          mbedtls_strerror(ret,err,100);
          goto LAB_00110a98;
        }
        if (ret == 0) {
          https_close(hi);
LAB_00110ae0:
          if ((hi->response).close == '\x01') {
            https_close(hi);
          }
          else {
            sVar4 = strlen(host);
            strncpy((hi->url).host,host,sVar4);
            sVar4 = strlen(port);
            strncpy((hi->url).port,port,sVar4);
            sVar4 = strlen(dir);
            strncpy((hi->url).path,dir,sVar4);
          }
          return (hi->response).status;
        }
        lVar3 = (ulong)ret + hi->r_len;
        hi->r_len = lVar3;
        hi->r_buf[lVar3] = '\0';
        iVar2 = http_parse(hi);
        if (iVar2 != 0) goto LAB_00110ae0;
      }
      lVar3 = hi->r_len;
    } while( true );
  }
  https_close(hi);
  mbedtls_strerror(ret,err,100);
LAB_00110a98:
  snprintf(response,0x100,"socket error: %s(%d)",err,(ulong)ret);
  return -1;
}

Assistant:

int http_get(HTTP_INFO *hi, char *url, char *response, int size)
{
    char        request[1024], err[100];
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt, len;
    socklen_t   slen;


    if(NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if( (hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0) )
    {
        https_close(hi);

        https_init(hi, https, verify);

        if((ret=https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);
            snprintf(response, 256, "socket error: %s(%d)", err, ret);
            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *)&opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if((ret=https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                mbedtls_strerror(ret, err, 100);
                snprintf(response, 256, "socket error: %s(%d)", err, ret);
                return -1;
            }
        }
    }

    /* Send HTTP request. */
    len = snprintf(request, 1024,
            "GET %s HTTP/1.1\r\n"
            "User-Agent: Mozilla/4.0\r\n"
            "Host: %s:%s\r\n"
            "Content-Type: application/json; charset=utf-8\r\n"
            "Connection: Keep-Alive\r\n"
            "%s\r\n",
            dir, host, port, hi->request.cookie);

    if((ret = https_write(hi, request, len)) != len)
    {
        https_close(hi);

        mbedtls_strerror(ret, err, 100);

        snprintf(response, 256, "socket error: %s(%d)", err, ret);

        return -1;
    }

//  printf("request: %s \r\n\r\n", request);

    hi->response.status = 0;
    hi->response.content_length = 0;
    hi->response.close = 0;

    hi->r_len = 0;
    hi->header_end = 0;

    hi->body = response;
    hi->body_size = size;
    hi->body_len = 0;

    while(1)
    {
        ret = https_read(hi, &hi->r_buf[hi->r_len], (int)(H_READ_SIZE - hi->r_len));
        if(ret == MBEDTLS_ERR_SSL_WANT_READ) continue;
        else if(ret < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);

            snprintf(response, 256, "socket error: %s(%d)", err, ret);

            return -1;
        }
        else if(ret == 0)
        {
            https_close(hi);
            break;
        }

        hi->r_len += ret;
        hi->r_buf[hi->r_len] = 0;

        // printf("read(%ld): |%s| \n", hi->r_len, hi->r_buf);
        // printf("read(%ld) ... \n", hi->r_len);

        if(http_parse(hi) != 0) break;
    }

    if(hi->response.close == 1)
    {
        https_close(hi);
    }
    else
    {
        strncpy(hi->url.host, host, strlen(host));
        strncpy(hi->url.port, port, strlen(port));
        strncpy(hi->url.path, dir, strlen(dir));
    }

    /*
    printf("status: %d \n", hi->response.status);
    printf("cookie: %s \n", hi->response.cookie);
    printf("location: %s \n", hi->response.location);
    printf("referrer: %s \n", hi->response.referrer);
    printf("length: %ld \n", hi->response.content_length);
    printf("body: %ld \n", hi->body_len);
    */

    return hi->response.status;

}